

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::AddEnumValueInternal
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  bool bVar1;
  int iVar2;
  FieldDescriptor *in_RDX;
  FieldDescriptor *in_stack_00000130;
  int in_stack_0000013c;
  bool in_stack_00000142;
  FieldType in_stack_00000143;
  int in_stack_00000144;
  ExtensionSet *in_stack_00000148;
  Message *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  Message *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    MutableExtensionSet((Reflection *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    iVar2 = FieldDescriptor::number(in_RDX);
    FieldDescriptor::type((FieldDescriptor *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
    FieldDescriptor::options(in_RDX);
    FieldOptions::packed((FieldOptions *)0x408073);
    internal::ExtensionSet::AddEnum
              (in_stack_00000148,in_stack_00000144,in_stack_00000143,in_stack_00000142,
               in_stack_0000013c,in_stack_00000130);
  }
  else {
    AddField<int>((Reflection *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffc8,
                  (FieldDescriptor *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                  (int *)in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void Reflection::AddEnumValueInternal(Message* message,
                                      const FieldDescriptor* field,
                                      int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->AddEnum(field->number(), field->type(),
                                          field->options().packed(), value,
                                          field);
  } else {
    AddField<int>(message, field, value);
  }
}